

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O3

char * deqp::gls::RandomArrayGenerator::createQuads<deqp::gls::GLValue::Half>
                 (int seed,int count,int componentCount,int offset,int stride,Primitive primitive,
                 Half min,Half max,float gridSize)

{
  undefined2 uVar1;
  char *pcVar2;
  Float<unsigned_short,_5,_10,_15,_1U> FVar3;
  Float<unsigned_short,_5,_10,_15,_1U> FVar4;
  Half HVar5;
  Half HVar6;
  Half HVar7;
  Half HVar8;
  Float<unsigned_int,_8,_23,_127,_3U> FVar9;
  int iVar10;
  long lVar11;
  undefined4 in_register_00000014;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  deUint32 u32;
  float fVar15;
  deRandom rnd;
  Float<unsigned_int,_8,_23,_127,_3U> local_d8;
  Half local_d2;
  float local_d0;
  deFloat16 local_ca;
  undefined1 local_c8 [16];
  long local_b0;
  float local_a8;
  Half local_a2;
  float local_a0;
  int local_9c;
  undefined8 local_98;
  ulong local_90;
  ulong local_88;
  int local_80;
  int local_7c;
  deRandom local_78;
  char *local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  char *local_40;
  ulong local_38;
  
  local_98 = CONCAT44(in_register_00000014,componentCount);
  uVar12 = (ulong)(uint)(componentCount * 2);
  if (stride != 0) {
    uVar12 = (ulong)(uint)stride;
  }
  iVar10 = (int)uVar12;
  local_38 = (ulong)(uint)(iVar10 * 2);
  local_9c = iVar10 * 6;
  if (primitive != PRIMITIVE_TRIANGLES) {
    local_9c = 0;
  }
  local_d0 = gridSize;
  local_68 = (char *)operator_new__((long)(local_9c * count + offset));
  deRandom_init(&local_78,seed);
  if (primitive == PRIMITIVE_TRIANGLES) {
    local_d8.m_value._0_2_ = max.m_value;
    FVar9 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                      ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_d8);
    local_c8 = ZEXT416(FVar9.m_value);
    local_d8.m_value._0_2_ = min.m_value;
    FVar9 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                      ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_d8);
    fVar15 = (float)local_c8._0_4_ - (float)FVar9.m_value;
    uVar13 = -(uint)(-fVar15 <= fVar15);
    local_d8.m_value =
         (StorageType)((float)(~uVar13 & (uint)-fVar15 | (uint)fVar15 & uVar13) * local_d0);
    FVar3 = tcu::Float<unsigned_short,5,10,15,1u>::convert<unsigned_int,8,23,127,3u>(&local_d8);
    local_d8.m_value = 0x40800000;
    FVar4 = tcu::Float<unsigned_short,5,10,15,1u>::convert<unsigned_int,8,23,127,3u>(&local_d8);
    local_d8.m_value._0_2_ = FVar4;
    local_d0 = (float)tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                                ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_d8);
    local_d8.m_value._0_2_ = FVar3.m_value;
    FVar9 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                      ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_d8);
    if ((float)FVar9.m_value < local_d0) {
      local_d8.m_value = 0x40800000;
      FVar3 = tcu::Float<unsigned_short,5,10,15,1u>::convert<unsigned_int,8,23,127,3u>(&local_d8);
    }
    if (0 < count) {
      local_40 = local_68 + offset;
      local_48 = (ulong)(uint)(iVar10 * 3);
      local_58 = (ulong)(uint)(iVar10 * 4);
      local_60 = (ulong)(uint)(iVar10 * 5);
      local_7c = 4;
      local_80 = 6;
      local_90 = 0;
      local_d2.m_value = FVar3.m_value;
      local_88 = uVar12;
      local_50 = (ulong)(uint)count;
      do {
        uVar13 = 0;
        while( true ) {
          local_d8.m_value._0_2_ = max.m_value;
          local_d0 = (float)tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                                      ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_d8);
          local_d8.m_value._0_2_ = min.m_value;
          FVar9 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                            ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_d8);
          HVar5.m_value = min.m_value;
          if ((float)FVar9.m_value <= local_d0) {
            local_d8.m_value._0_2_ = max.m_value;
            local_d0 = (float)tcu::Float<unsigned_int,8,23,127,3u>::
                              convert<unsigned_short,5,10,15,3u>
                                        ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_d8);
            local_d8.m_value._0_2_ = min.m_value;
            FVar9 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                              ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_d8);
            local_c8._0_4_ = FVar9.m_value;
            fVar15 = deRandom_getFloat(&local_78);
            local_d8.m_value =
                 (StorageType)((local_d0 - (float)local_c8._0_4_) * fVar15 + (float)local_c8._0_4_);
            HVar5.m_value =
                 (deFloat16)
                 tcu::Float<unsigned_short,5,10,15,1u>::convert<unsigned_int,8,23,127,3u>(&local_d8)
            ;
          }
          local_d8.m_value._0_2_ = HVar5.m_value;
          HVar6 = roundTo<deqp::gls::GLValue::Half>(&local_d2,(Half *)&local_d8);
          HVar5.m_value = local_d2.m_value;
          local_d8.m_value._0_2_ = max.m_value;
          local_d0 = (float)tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                                      ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_d8);
          local_a0 = (float)CONCAT22(local_a0._2_2_,HVar6.m_value);
          local_d8.m_value._0_2_ = HVar6.m_value;
          FVar9 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                            ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_d8);
          local_d8.m_value = (StorageType)(local_d0 - FVar9.m_value);
          FVar3 = tcu::Float<unsigned_short,5,10,15,1u>::convert<unsigned_int,8,23,127,3u>
                            (&local_d8);
          local_d8.m_value._0_2_ = FVar3.m_value;
          FVar9 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                            ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_d8);
          local_d8.m_value = FVar9.m_value & 0x7fffffff;
          FVar3 = tcu::Float<unsigned_short,5,10,15,1u>::convert<unsigned_int,8,23,127,3u>
                            (&local_d8);
          local_d8.m_value._0_2_ = FVar3;
          local_d0 = (float)tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                                      ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_d8);
          local_d8.m_value._0_2_ = HVar5.m_value;
          FVar9 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                            ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_d8);
          if ((float)FVar9.m_value <= local_d0) {
            local_d8.m_value._0_2_ = FVar3;
            local_d0 = (float)tcu::Float<unsigned_int,8,23,127,3u>::
                              convert<unsigned_short,5,10,15,3u>
                                        ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_d8);
            local_d8.m_value._0_2_ = HVar5.m_value;
            FVar9 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                              ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_d8);
            local_c8._0_4_ = FVar9.m_value;
            fVar15 = deRandom_getFloat(&local_78);
            local_d8.m_value =
                 (StorageType)((local_d0 - (float)local_c8._0_4_) * fVar15 + (float)local_c8._0_4_);
            HVar5.m_value =
                 (deFloat16)
                 tcu::Float<unsigned_short,5,10,15,1u>::convert<unsigned_int,8,23,127,3u>(&local_d8)
            ;
          }
          local_d8.m_value._0_2_ = HVar5.m_value;
          HVar5 = roundTo<deqp::gls::GLValue::Half>(&local_d2,(Half *)&local_d8);
          local_d0 = (float)CONCAT22(local_d0._2_2_,HVar5.m_value);
          local_d8.m_value._0_2_ = max.m_value;
          FVar9 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                            ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_d8);
          local_d8.m_value._0_2_ = min.m_value;
          local_c8._0_4_ = FVar9;
          FVar9 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                            ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_d8);
          HVar5.m_value = min.m_value;
          if ((float)FVar9.m_value <= (float)local_c8._0_4_) {
            local_d8.m_value._0_2_ = max.m_value;
            local_c8._0_4_ =
                 tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                           ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_d8);
            local_d8.m_value._0_2_ = min.m_value;
            FVar9 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                              ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_d8);
            local_b0 = CONCAT44(local_b0._4_4_,FVar9.m_value);
            fVar15 = deRandom_getFloat(&local_78);
            local_d8.m_value =
                 (StorageType)(((float)local_c8._0_4_ - (float)local_b0) * fVar15 + (float)local_b0)
            ;
            HVar5.m_value =
                 (deFloat16)
                 tcu::Float<unsigned_short,5,10,15,1u>::convert<unsigned_int,8,23,127,3u>(&local_d8)
            ;
          }
          local_d8.m_value._0_2_ = HVar5.m_value;
          HVar6 = roundTo<deqp::gls::GLValue::Half>(&local_d2,(Half *)&local_d8);
          HVar5.m_value = local_d2.m_value;
          local_d8.m_value._0_2_ = max.m_value;
          local_c8._0_4_ =
               tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                         ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_d8);
          local_d8.m_value._0_2_ = HVar6.m_value;
          FVar9 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                            ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_d8);
          local_d8.m_value = (StorageType)((float)local_c8._0_4_ - FVar9.m_value);
          FVar3 = tcu::Float<unsigned_short,5,10,15,1u>::convert<unsigned_int,8,23,127,3u>
                            (&local_d8);
          local_d8.m_value._0_2_ = FVar3.m_value;
          FVar9 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                            ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_d8);
          local_d8.m_value = FVar9.m_value & 0x7fffffff;
          FVar3 = tcu::Float<unsigned_short,5,10,15,1u>::convert<unsigned_int,8,23,127,3u>
                            (&local_d8);
          local_d8.m_value._0_2_ = FVar3;
          local_c8._0_4_ =
               tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                         ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_d8);
          local_d8.m_value._0_2_ = HVar5.m_value;
          FVar9 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                            ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_d8);
          if ((float)FVar9.m_value <= (float)local_c8._0_4_) {
            local_d8.m_value._0_2_ = FVar3;
            FVar9 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                              ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_d8);
            local_c8._0_4_ = FVar9.m_value;
            local_d8.m_value._0_2_ = HVar5.m_value;
            FVar9 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                              ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_d8);
            local_b0 = CONCAT44(local_b0._4_4_,FVar9.m_value);
            fVar15 = deRandom_getFloat(&local_78);
            local_d8.m_value =
                 (StorageType)(((float)local_c8._0_4_ - (float)local_b0) * fVar15 + (float)local_b0)
            ;
            HVar5.m_value =
                 (deFloat16)
                 tcu::Float<unsigned_short,5,10,15,1u>::convert<unsigned_int,8,23,127,3u>(&local_d8)
            ;
          }
          local_d8.m_value._0_2_ = HVar5.m_value;
          HVar5 = roundTo<deqp::gls::GLValue::Half>(&local_d2,(Half *)&local_d8);
          if ((int)local_98 < 3) break;
          local_d8.m_value._0_2_ = max.m_value;
          FVar9 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                            ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_d8);
          local_d8.m_value._0_2_ = min.m_value;
          local_c8._0_4_ = FVar9;
          FVar9 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                            ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_d8);
          HVar7.m_value = min.m_value;
          if ((float)FVar9.m_value <= (float)local_c8._0_4_) {
            local_d8.m_value._0_2_ = max.m_value;
            local_c8._0_4_ =
                 tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                           ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_d8);
            local_d8.m_value._0_2_ = min.m_value;
            FVar9 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                              ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_d8);
            local_b0 = CONCAT44(local_b0._4_4_,FVar9.m_value);
            fVar15 = deRandom_getFloat(&local_78);
            local_d8.m_value =
                 (StorageType)(((float)local_c8._0_4_ - (float)local_b0) * fVar15 + (float)local_b0)
            ;
            HVar7.m_value =
                 (deFloat16)
                 tcu::Float<unsigned_short,5,10,15,1u>::convert<unsigned_int,8,23,127,3u>(&local_d8)
            ;
          }
          local_a2.m_value = HVar7.m_value;
          HVar7 = roundTo<deqp::gls::GLValue::Half>(&local_d2,&local_a2);
          if ((int)local_98 == 3) {
            local_d8.m_value = 0x3f800000;
            FVar3 = tcu::Float<unsigned_short,5,10,15,1u>::convert<unsigned_int,8,23,127,3u>
                              (&local_d8);
          }
          else {
            local_d8.m_value._0_2_ = max.m_value;
            local_c8._0_4_ =
                 tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                           ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_d8);
            local_d8.m_value._0_2_ = min.m_value;
            FVar9 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                              ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_d8);
            HVar8.m_value = min.m_value;
            if ((float)FVar9.m_value <= (float)local_c8._0_4_) {
              local_d8.m_value._0_2_ = max.m_value;
              local_c8._0_4_ =
                   tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                             ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_d8);
              local_d8.m_value._0_2_ = min.m_value;
              FVar9 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                                ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_d8);
              local_b0 = CONCAT44(local_b0._4_4_,FVar9.m_value);
              fVar15 = deRandom_getFloat(&local_78);
              local_d8.m_value =
                   (StorageType)
                   (((float)local_c8._0_4_ - (float)local_b0) * fVar15 + (float)local_b0);
              HVar8.m_value =
                   (deFloat16)
                   tcu::Float<unsigned_short,5,10,15,1u>::convert<unsigned_int,8,23,127,3u>
                             (&local_d8);
            }
            local_a2.m_value = HVar8.m_value;
            FVar3.m_value =
                 (StorageType_conflict)roundTo<deqp::gls::GLValue::Half>(&local_d2,&local_a2);
          }
          local_d8.m_value._0_2_ = local_d0._0_2_;
          local_c8._0_4_ =
               tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                         ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_d8);
          local_d8.m_value._0_2_ = (StorageType_conflict)HVar7;
          FVar9 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                            ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_d8);
          fVar15 = (float)FVar9.m_value + (float)local_c8._0_4_;
          uVar14 = -(uint)(-fVar15 <= fVar15);
          local_c8 = ZEXT416(~uVar14 & (uint)-fVar15 | (uint)fVar15 & uVar14);
          local_d8.m_value._0_2_ = local_d2.m_value;
          FVar9 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                            ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_d8);
          if ((float)FVar9.m_value <= (float)local_c8._0_4_) {
            local_d8.m_value._0_2_ = (StorageType_conflict)HVar5;
            FVar9 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                              ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_d8);
            local_c8._0_4_ = FVar9;
            local_d8.m_value._0_2_ = FVar3.m_value;
            FVar9 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                              ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_d8);
            fVar15 = (float)FVar9.m_value + (float)local_c8._0_4_;
            uVar14 = -(uint)(-fVar15 <= fVar15);
            local_c8 = ZEXT416(~uVar14 & (uint)-fVar15 | (uint)fVar15 & uVar14);
            local_d8.m_value._0_2_ = local_d2.m_value;
            FVar9 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                              ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_d8);
            if ((float)FVar9.m_value <= (float)local_c8._0_4_) goto LAB_01862074;
          }
          if (2 < uVar13) goto LAB_01862074;
          uVar13 = uVar13 + 1;
        }
        local_d8.m_value = 0;
        HVar7.m_value =
             (deFloat16)
             tcu::Float<unsigned_short,5,10,15,1u>::convert<unsigned_int,8,23,127,3u>(&local_d8);
        local_d8.m_value = 0x3f800000;
        FVar3 = tcu::Float<unsigned_short,5,10,15,1u>::convert<unsigned_int,8,23,127,3u>(&local_d8);
LAB_01862074:
        pcVar2 = local_40;
        iVar10 = local_9c * (int)local_90;
        *(undefined2 *)(local_40 + iVar10) = local_a0._0_2_;
        *(deFloat16 *)(local_40 + (iVar10 + 2)) = HVar6.m_value;
        local_b0 = (long)((int)local_88 + iVar10);
        local_d8.m_value._0_2_ = local_a0._0_2_;
        local_ca = HVar6.m_value;
        local_a8 = (float)tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                                    ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_d8);
        local_d8.m_value._0_2_ = local_d0._0_2_;
        FVar9 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                          ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_d8);
        local_d8.m_value = (StorageType)(FVar9.m_value + local_a8);
        FVar4 = tcu::Float<unsigned_short,5,10,15,1u>::convert<unsigned_int,8,23,127,3u>(&local_d8);
        *(StorageType_conflict *)(pcVar2 + local_b0) = FVar4.m_value;
        *(deFloat16 *)(pcVar2 + ((int)local_88 + iVar10 + 2)) = local_ca;
        *(undefined2 *)(pcVar2 + (iVar10 + (int)local_38)) = local_a0._0_2_;
        local_b0 = (long)(iVar10 + 2 + (int)local_38);
        local_d8.m_value._0_2_ = local_ca;
        local_a8 = (float)tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                                    ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_d8);
        local_d8.m_value._0_2_ = HVar5.m_value;
        FVar9 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                          ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_d8);
        local_d8.m_value = (StorageType)(FVar9.m_value + local_a8);
        FVar4 = tcu::Float<unsigned_short,5,10,15,1u>::convert<unsigned_int,8,23,127,3u>(&local_d8);
        *(StorageType_conflict *)(pcVar2 + local_b0) = FVar4.m_value;
        local_c8._0_8_ = (long)iVar10;
        uVar1 = local_a0._0_2_;
        *(undefined2 *)(pcVar2 + (iVar10 + (int)local_48)) = local_a0._0_2_;
        local_b0 = (long)(iVar10 + 2 + (int)local_48);
        local_d8.m_value._0_2_ = local_ca;
        local_a8 = (float)tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                                    ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_d8);
        local_d8.m_value._0_2_ = HVar5.m_value;
        FVar9 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                          ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_d8);
        local_d8.m_value = (StorageType)(FVar9.m_value + local_a8);
        FVar4 = tcu::Float<unsigned_short,5,10,15,1u>::convert<unsigned_int,8,23,127,3u>(&local_d8);
        *(StorageType_conflict *)(pcVar2 + local_b0) = FVar4.m_value;
        local_b0 = (long)(local_c8._0_4_ + (int)local_58);
        local_d8.m_value._0_2_ = uVar1;
        local_a8 = (float)tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                                    ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_d8);
        local_d8.m_value._0_2_ = local_d0._0_2_;
        FVar9 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                          ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_d8);
        local_d8.m_value = (StorageType)(FVar9.m_value + local_a8);
        FVar4 = tcu::Float<unsigned_short,5,10,15,1u>::convert<unsigned_int,8,23,127,3u>(&local_d8);
        *(StorageType_conflict *)(pcVar2 + local_b0) = FVar4.m_value;
        *(deFloat16 *)(pcVar2 + (local_c8._0_4_ + 2 + (int)local_58)) = local_ca;
        local_b0 = (long)(local_c8._0_4_ + (int)local_60);
        local_d8.m_value._0_2_ = uVar1;
        local_a0 = (float)tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                                    ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_d8);
        local_d8.m_value._0_2_ = local_d0._0_2_;
        FVar9 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                          ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_d8);
        local_d8.m_value = (StorageType)(FVar9.m_value + local_a0);
        FVar4 = tcu::Float<unsigned_short,5,10,15,1u>::convert<unsigned_int,8,23,127,3u>(&local_d8);
        *(StorageType_conflict *)(pcVar2 + local_b0) = FVar4.m_value;
        local_d8.m_value._0_2_ = local_ca;
        local_d0 = (float)tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                                    ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_d8);
        local_d8.m_value._0_2_ = HVar5.m_value;
        FVar9 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                          ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_d8);
        local_d8.m_value = (StorageType)(FVar9.m_value + local_d0);
        FVar4 = tcu::Float<unsigned_short,5,10,15,1u>::convert<unsigned_int,8,23,127,3u>(&local_d8);
        *(StorageType_conflict *)(pcVar2 + (local_c8._0_4_ + (int)local_60 + 2)) = FVar4.m_value;
        if (2 < (int)local_98) {
          lVar11 = 6;
          iVar10 = local_7c;
          do {
            *(deFloat16 *)(pcVar2 + iVar10) = HVar7.m_value;
            iVar10 = iVar10 + (int)local_88;
            lVar11 = lVar11 + -1;
          } while (lVar11 != 0);
          if ((int)local_98 != 3) {
            lVar11 = 6;
            iVar10 = local_80;
            do {
              *(StorageType_conflict *)(pcVar2 + iVar10) = FVar3.m_value;
              iVar10 = iVar10 + (int)local_88;
              lVar11 = lVar11 + -1;
            } while (lVar11 != 0);
          }
        }
        local_90 = local_90 + 1;
        local_7c = local_7c + local_9c;
        local_80 = local_80 + local_9c;
      } while (local_90 != local_50);
    }
  }
  return local_68;
}

Assistant:

char* RandomArrayGenerator::createQuads (int seed, int count, int componentCount, int offset, int stride, Array::Primitive primitive, T min, T max, float gridSize)
{
	int componentStride = sizeof(T);
	int quadStride = 0;

	if (stride == 0)
		stride = componentCount * componentStride;

	DE_ASSERT(stride >= componentCount * componentStride);

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
			quadStride = stride * 6;
			break;

		default:
			DE_ASSERT(false);
			break;
	}

	char* resultData = new char[offset + quadStride * count];
	char* _data = resultData;
	resultData = resultData + offset;

	deRandom rnd;
	deRandom_init(&rnd,  seed);

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
		{
			const T	minQuadSize	= T::fromFloat(deFloatAbs(max.template to<float>() - min.template to<float>()) * gridSize);
			const T	minDiff		= minValue<T>() > minQuadSize
								? minValue<T>()
								: minQuadSize;

			for (int quadNdx = 0; quadNdx < count; ++quadNdx)
			{
				T x1, x2;
				T y1, y2;
				T z, w;

				// attempt to find a good (i.e not extremely small) quad
				for (int attemptNdx = 0; attemptNdx < 4; ++attemptNdx)
				{
					x1 = roundTo(minDiff, getRandom<T>(rnd, min, max));
					x2 = roundTo(minDiff, getRandom<T>(rnd, minDiff, abs<T>(max - x1)));

					y1 = roundTo(minDiff, getRandom<T>(rnd, min, max));
					y2 = roundTo(minDiff, getRandom<T>(rnd, minDiff, abs<T>(max - y1)));

					z = (componentCount > 2) ? roundTo(minDiff, (getRandom<T>(rnd, min, max))) : (T::create(0));
					w = (componentCount > 3) ? roundTo(minDiff, (getRandom<T>(rnd, min, max))) : (T::create(1));

					// no additional components, all is good
					if (componentCount <= 2)
						break;

					// The result quad is too thin?
					if ((deFloatAbs(x2.template to<float>() + z.template to<float>()) < minDiff.template to<float>()) ||
						(deFloatAbs(y2.template to<float>() + w.template to<float>()) < minDiff.template to<float>()))
						continue;

					// all ok
					break;
				}

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 2]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 2 + componentStride]), y1 + y2);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 3]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 3 + componentStride]), y1 + y2);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 4]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 4 + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 5]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 5 + componentStride]), y1 + y2);

				if (componentCount > 2)
				{
					for (int i = 0; i < 6; i++)
						alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * i + componentStride * 2]), z);
				}

				if (componentCount > 3)
				{
					for (int i = 0; i < 6; i++)
						alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * i + componentStride * 3]), w);
				}
			}

			break;
		}

		default:
			DE_ASSERT(false);
			break;
	}

	return _data;
}